

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O0

void Am_Scripting_Register_Palette
               (Am_Object *undo_handler,Am_Object *palette,Am_Value *slot_or_type)

{
  Am_Slot_Key key;
  bool bVar1;
  Am_Value *list_value;
  Am_Wrapper *pAVar2;
  ostream *poVar3;
  void *this;
  Am_Assoc local_38;
  Am_Assoc as;
  Am_Value_List palette_registry;
  Am_Value *slot_or_type_local;
  Am_Object *palette_local;
  Am_Object *undo_handler_local;
  
  bVar1 = Am_Am_Slot_Key::Test(slot_or_type);
  if (bVar1) {
    Am_Object::Set(palette,0x19c,slot_or_type,1);
  }
  list_value = Am_Object::Get(undo_handler,Am_REGISTRY_FOR_PALETTES,3);
  Am_Value_List::Am_Value_List((Am_Value_List *)&as,list_value);
  pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(palette);
  Am_Assoc::Am_Assoc(&local_38,pAVar2,slot_or_type);
  pAVar2 = Am_Assoc::operator_cast_to_Am_Wrapper_(&local_38);
  Am_Value_List::Add((Am_Value_List *)&as,pAVar2,Am_TAIL,true);
  key = Am_REGISTRY_FOR_PALETTES;
  pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&as);
  Am_Object::Set(undo_handler,key,pAVar2,1);
  if ((am_sdebug & 1U) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Registering palette ");
    poVar3 = operator<<(poVar3,palette);
    poVar3 = std::operator<<(poVar3," for ");
    poVar3 = operator<<(poVar3,slot_or_type);
    poVar3 = std::operator<<(poVar3," to ");
    poVar3 = operator<<(poVar3,undo_handler);
    poVar3 = std::operator<<(poVar3," got new list ");
    poVar3 = operator<<(poVar3,(Am_Value_List *)&as);
    this = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(this,std::flush<char,std::char_traits<char>>);
  }
  Am_Assoc::~Am_Assoc(&local_38);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&as);
  return;
}

Assistant:

void
Am_Scripting_Register_Palette(Am_Object undo_handler, Am_Object palette,
                              Am_Value slot_or_type)
{
  if (Am_Am_Slot_Key::Test(slot_or_type)) {
    palette.Set(Am_SLOT_FOR_VALUE, slot_or_type, Am_OK_IF_NOT_THERE);
  }
  Am_Value_List palette_registry =
      undo_handler.Get(Am_REGISTRY_FOR_PALETTES, Am_RETURN_ZERO_ON_ERROR);
  Am_Assoc as(palette, slot_or_type);
  palette_registry.Add(as);
  undo_handler.Set(Am_REGISTRY_FOR_PALETTES, palette_registry,
                   Am_OK_IF_NOT_THERE);
  if (am_sdebug)
    std::cout << "Registering palette " << palette << " for " << slot_or_type
              << " to " << undo_handler << " got new list " << palette_registry
              << std::endl
              << std::flush;
}